

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

void Curl_http2_done(Curl_easy *data,_Bool premature)

{
  char ***pppcVar1;
  connectdata *pcVar2;
  HTTP *pHVar3;
  nghttp2_session *session;
  int iVar4;
  size_t sVar5;
  
  pcVar2 = data->conn;
  pHVar3 = (data->req).p.http;
  Curl_dyn_free(&pHVar3->header_recvbuf);
  Curl_dyn_free(&pHVar3->trailer_recvbuf);
  if (pHVar3->push_headers != (char **)0x0) {
    sVar5 = pHVar3->push_headers_used;
    while (sVar5 != 0) {
      (*Curl_cfree)(pHVar3->push_headers[sVar5 - 1]);
      sVar5 = pHVar3->push_headers_used - 1;
      pHVar3->push_headers_used = sVar5;
    }
    (*Curl_cfree)(pHVar3->push_headers);
    pHVar3->push_headers = (char **)0x0;
  }
  if (((data->conn->handler->protocol & 3) != 0) &&
     (session = (pcVar2->proto).httpc.h2, session != (nghttp2_session *)0x0)) {
    iVar4 = pHVar3->stream_id;
    if (iVar4 == (pcVar2->proto).httpc.pause_stream_id) {
      (pcVar2->proto).httpc.pause_stream_id = 0;
    }
    if ((premature) || ((iVar4 != 0 && (pHVar3->closed == false)))) {
      (pcVar2->proto).httpc.trnsfr = data;
      iVar4 = nghttp2_submit_rst_stream(session,'\0',iVar4,5);
      if (iVar4 == 0) {
        nghttp2_session_send((pcVar2->proto).httpc.h2);
      }
    }
    sVar5 = (data->state).drain;
    if (sVar5 != 0) {
      pppcVar1 = &(pcVar2->proto).ftpc.dirs;
      *pppcVar1 = (char **)((long)*pppcVar1 - sVar5);
      (data->state).drain = 0;
    }
    if (0 < pHVar3->stream_id) {
      iVar4 = nghttp2_session_set_stream_user_data
                        ((pcVar2->proto).httpc.h2,pHVar3->stream_id,(void *)0x0);
      if (iVar4 != 0) {
        Curl_infof(data,"http/2: failed to clear user_data for stream %u",
                   (ulong)(uint)pHVar3->stream_id);
      }
      (pcVar2->proto).ftpc.pp.sendbuf.bufr = (char *)0x0;
      pHVar3->stream_id = 0;
    }
  }
  return;
}

Assistant:

void Curl_http2_done(struct Curl_easy *data, bool premature)
{
  struct HTTP *http = data->req.p.http;
  struct http_conn *httpc = &data->conn->proto.httpc;

  /* there might be allocated resources done before this got the 'h2' pointer
     setup */
  Curl_dyn_free(&http->header_recvbuf);
  Curl_dyn_free(&http->trailer_recvbuf);
  if(http->push_headers) {
    /* if they weren't used and then freed before */
    for(; http->push_headers_used > 0; --http->push_headers_used) {
      free(http->push_headers[http->push_headers_used - 1]);
    }
    free(http->push_headers);
    http->push_headers = NULL;
  }

  if(!(data->conn->handler->protocol&PROTO_FAMILY_HTTP) ||
     !httpc->h2) /* not HTTP/2 ? */
    return;

  /* do this before the reset handling, as that might clear ->stream_id */
  if(http->stream_id == httpc->pause_stream_id) {
    H2BUGF(infof(data, "DONE the pause stream (%u)", http->stream_id));
    httpc->pause_stream_id = 0;
  }
  if(premature || (!http->closed && http->stream_id)) {
    /* RST_STREAM */
    set_transfer(httpc, data); /* set the transfer */
    H2BUGF(infof(data, "RST stream %u", http->stream_id));
    if(!nghttp2_submit_rst_stream(httpc->h2, NGHTTP2_FLAG_NONE,
                                  http->stream_id, NGHTTP2_STREAM_CLOSED))
      (void)nghttp2_session_send(httpc->h2);
  }

  if(data->state.drain)
    drained_transfer(data, httpc);

  /* -1 means unassigned and 0 means cleared */
  if(http->stream_id > 0) {
    int rv = nghttp2_session_set_stream_user_data(httpc->h2,
                                                  http->stream_id, 0);
    if(rv) {
      infof(data, "http/2: failed to clear user_data for stream %u",
            http->stream_id);
      DEBUGASSERT(0);
    }
    set_transfer(httpc, NULL);
    http->stream_id = 0;
  }
}